

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::MatchesRegexEqHelper::Assertion<char_const*,char_const*>
          (AssertionResult *__return_storage_ptr__,MatchesRegexEqHelper *this,char *regex_str,
          char *actual_str,char **regex,char **actual)

{
  bool bVar1;
  char **v;
  char **v_00;
  string expected_str;
  string local_90;
  char *local_70 [4];
  string local_50;
  
  bVar1 = Compare<char_const*,char_const*>((char **)actual_str,regex);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"Matches Regex (",(allocator<char> *)&local_90);
    std::__cxx11::string::append((char *)local_70);
    std::__cxx11::string::append((char *)local_70);
    iutest::PrintToString<char_const*>(&local_90,(iutest *)actual_str,v);
    iutest::PrintToString<char_const*>(&local_50,(iutest *)regex,v_00);
    iutest::internal::EqFailure
              (__return_storage_ptr__,local_70[0],regex_str,&local_90,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* regex_str, const char* actual_str
    , const T1& regex, const T2& actual)
{
    if( Compare(regex, actual) )
    {
        return ::iutest::AssertionSuccess();
    }
    ::std::string expected_str = "Matches Regex (";
    expected_str += regex_str;
    expected_str += ")";

    return ::iutest::internal::EqFailure(expected_str.c_str(), actual_str
        , ::iutest::PrintToString(regex)
        , ::iutest::PrintToString(actual)
        , false);
}